

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::XFBVertexStreamsTest::getBufferDescriptors
          (XFBVertexStreamsTest *this,GLuint param_1,Vector *out_descriptors)

{
  value_type vVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  const_reference pvVar5;
  uint local_120;
  GLuint i;
  GLuint type_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *bulma_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_e0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vegeta_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *picolo_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *goten_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *gohan_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *goku_data;
  bufferDescriptor *xfb_3;
  bufferDescriptor *xfb_2;
  bufferDescriptor *xfb_1;
  bufferDescriptor *uniform;
  Type *type;
  Vector *out_descriptors_local;
  XFBVertexStreamsTest *pXStack_10;
  GLuint param_2_local;
  XFBVertexStreamsTest *this_local;
  
  uniform = (bufferDescriptor *)&Utils::Type::vec4;
  type = (Type *)out_descriptors;
  out_descriptors_local._4_4_ = param_1;
  pXStack_10 = this;
  std::
  vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
  ::resize(out_descriptors,4);
  xfb_1 = std::
          vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
          ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                        *)type,0);
  xfb_2 = std::
          vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
          ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                        *)type,1);
  xfb_3 = std::
          vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
          ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                        *)type,2);
  goku_data = &std::
               vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
               ::operator[]((vector<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferDescriptor>_>
                             *)type,3)->m_expected_data;
  xfb_1->m_index = 0;
  xfb_2->m_index = 1;
  xfb_3->m_index = 2;
  ((reference)goku_data)->m_index = 3;
  xfb_1->m_target = Uniform;
  xfb_2->m_target = Transform_feedback;
  xfb_3->m_target = Transform_feedback;
  ((reference)goku_data)->m_target = Transform_feedback;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gohan_data,
             (Type *)&Utils::Type::vec4);
  local_50 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gohan_data;
  Utils::Type::GenerateData(&local_88,(Type *)&Utils::Type::vec4);
  local_70 = &local_88;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&picolo_data,
             (Type *)&Utils::Type::vec4);
  local_a0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&picolo_data;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&vegeta_data,
             (Type *)&Utils::Type::vec4);
  local_c0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&vegeta_data;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bulma_data,
             (Type *)&Utils::Type::vec4);
  local_e0 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bulma_data;
  Utils::Type::GenerateData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,(Type *)&Utils::Type::vec4)
  ;
  local_100 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_e0);
  iVar2 = (int)sVar3;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&xfb_1->m_initial_data,(ulong)(uint)(iVar2 * 6));
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_1->m_initial_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_50,0);
  memcpy(pvVar4,pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_1->m_initial_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_70,0);
  memcpy(pvVar4 + (sVar3 & 0xffffffff),pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_1->m_initial_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_a0,0);
  memcpy(pvVar4 + (uint)(iVar2 * 2),pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_1->m_initial_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_c0,0);
  memcpy(pvVar4 + (uint)(iVar2 * 3),pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_1->m_initial_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_e0,0);
  memcpy(pvVar4 + (uint)(iVar2 << 2),pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_1->m_initial_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_100,0);
  memcpy(pvVar4 + (uint)(iVar2 * 5),pvVar5,sVar3 & 0xffffffff);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&xfb_2->m_initial_data,0x40);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&xfb_2->m_expected_data,0x40);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&xfb_3->m_initial_data,0x40);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&xfb_3->m_expected_data,0x40);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(goku_data + 1,0x40);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(goku_data,0x40);
  for (local_120 = 0; local_120 < 0x40; local_120 = local_120 + 1) {
    vVar1 = (value_type)local_120;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&xfb_2->m_initial_data,(ulong)local_120);
    *pvVar4 = vVar1;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&xfb_2->m_expected_data,(ulong)local_120);
    *pvVar4 = vVar1;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&xfb_3->m_initial_data,(ulong)local_120);
    *pvVar4 = vVar1;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&xfb_3->m_expected_data,(ulong)local_120);
    *pvVar4 = vVar1;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (goku_data + 1,(ulong)local_120);
    *pvVar4 = vVar1;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (goku_data,(ulong)local_120);
    *pvVar4 = vVar1;
  }
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_2->m_expected_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_50,0);
  memcpy(pvVar4 + 0x30,pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_2->m_expected_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_70,0);
  memcpy(pvVar4 + 0x20,pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_2->m_expected_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_a0,0);
  memcpy(pvVar4 + 0x10,pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](goku_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_c0,0);
  memcpy(pvVar4 + 0x30,pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](goku_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_e0,0);
  memcpy(pvVar4 + 0x20,pvVar5,sVar3 & 0xffffffff);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&xfb_3->m_expected_data,0);
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_100,0);
  memcpy(pvVar4 + 0x20,pvVar5,sVar3 & 0xffffffff);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bulma_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&vegeta_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&picolo_data);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gohan_data);
  return;
}

Assistant:

void XFBVertexStreamsTest::getBufferDescriptors(glw::GLuint /* test_case_index */,
												bufferDescriptor::Vector& out_descriptors)
{
	const Utils::Type& type = Utils::Type::vec4;

	/* Test needs single uniform and three xfbs */
	out_descriptors.resize(4);

	/* Get references */
	bufferDescriptor& uniform = out_descriptors[0];
	bufferDescriptor& xfb_1   = out_descriptors[1];
	bufferDescriptor& xfb_2   = out_descriptors[2];
	bufferDescriptor& xfb_3   = out_descriptors[3];

	/* Index */
	uniform.m_index = 0;
	xfb_1.m_index   = 1;
	xfb_2.m_index   = 2;
	xfb_3.m_index   = 3;

	/* Target */
	uniform.m_target = Utils::Buffer::Uniform;
	xfb_1.m_target   = Utils::Buffer::Transform_feedback;
	xfb_2.m_target   = Utils::Buffer::Transform_feedback;
	xfb_3.m_target   = Utils::Buffer::Transform_feedback;

	/* Data */
	const std::vector<GLubyte>& goku_data   = type.GenerateData();
	const std::vector<GLubyte>& gohan_data  = type.GenerateData();
	const std::vector<GLubyte>& goten_data  = type.GenerateData();
	const std::vector<GLubyte>& picolo_data = type.GenerateData();
	const std::vector<GLubyte>& vegeta_data = type.GenerateData();
	const std::vector<GLubyte>& bulma_data  = type.GenerateData();

	const GLuint type_size = static_cast<GLuint>(vegeta_data.size());

	/* Uniform data */
	uniform.m_initial_data.resize(6 * type_size);
	memcpy(&uniform.m_initial_data[0] + 0, &goku_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + type_size, &gohan_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 2 * type_size, &goten_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 3 * type_size, &picolo_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 4 * type_size, &vegeta_data[0], type_size);
	memcpy(&uniform.m_initial_data[0] + 5 * type_size, &bulma_data[0], type_size);

	/* XFB data */
	static const GLuint xfb_stride = 64;
	xfb_1.m_initial_data.resize(xfb_stride);
	xfb_1.m_expected_data.resize(xfb_stride);
	xfb_2.m_initial_data.resize(xfb_stride);
	xfb_2.m_expected_data.resize(xfb_stride);
	xfb_3.m_initial_data.resize(xfb_stride);
	xfb_3.m_expected_data.resize(xfb_stride);

	for (GLuint i = 0; i < xfb_stride; ++i)
	{
		xfb_1.m_initial_data[i]  = (glw::GLubyte)i;
		xfb_1.m_expected_data[i] = (glw::GLubyte)i;
		xfb_2.m_initial_data[i]  = (glw::GLubyte)i;
		xfb_2.m_expected_data[i] = (glw::GLubyte)i;
		xfb_3.m_initial_data[i]  = (glw::GLubyte)i;
		xfb_3.m_expected_data[i] = (glw::GLubyte)i;
	}

	memcpy(&xfb_1.m_expected_data[0] + 48, &goku_data[0], type_size);
	memcpy(&xfb_1.m_expected_data[0] + 32, &gohan_data[0], type_size);
	memcpy(&xfb_1.m_expected_data[0] + 16, &goten_data[0], type_size);
	memcpy(&xfb_3.m_expected_data[0] + 48, &picolo_data[0], type_size);
	memcpy(&xfb_3.m_expected_data[0] + 32, &vegeta_data[0], type_size);
	memcpy(&xfb_2.m_expected_data[0] + 32, &bulma_data[0], type_size);
}